

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O3

Abc_Ntk_t * Io_ReadBlifNetworkOne(Io_ReadBlif_t *p)

{
  char cVar1;
  byte bVar2;
  Vec_Ptr_t *pVVar3;
  double dVar4;
  Abc_Obj_t *pAVar5;
  size_t __size;
  bool bVar6;
  FILE *pFile;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Abc_Ntk_t *pAVar11;
  char *pcVar12;
  Vec_Ptr_t *pVVar13;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar14;
  Mio_Gate_t *pMVar15;
  size_t sVar16;
  ulong uVar17;
  Abc_Obj_t *pAVar18;
  long lVar19;
  void *pvVar20;
  void *pvVar21;
  long lVar22;
  void **ppvVar23;
  char *pcVar24;
  Vec_Int_t *p_00;
  Vec_Str_t *pVVar25;
  char *pcVar26;
  char **pNamesIn;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  char *pFoo1;
  char *local_78;
  char *local_70;
  Abc_Obj_t *local_68;
  ProgressBar *local_60;
  undefined1 local_58 [16];
  uint local_44;
  Abc_Ntk_t *local_40;
  Abc_Ntk_t *local_38;
  
  if (p->vTokens == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vTokens != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0xf2,"Abc_Ntk_t *Io_ReadBlifNetworkOne(Io_ReadBlif_t *)");
  }
  pAVar11 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_SOP,1);
  p->pNtkCur = pAVar11;
  pVVar13 = p->vTokens;
  ppvVar23 = pVVar13->pArray;
  pcVar12 = (char *)*ppvVar23;
  iVar7 = strcmp(pcVar12,".model");
  if (iVar7 == 0) {
    if (pVVar13->nSize != 2) {
      iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
      p->LineCur = iVar7;
      builtin_strncpy(p->sError,"The .model line does not have exactly two entries.",0x33);
      Io_ReadBlifPrintErrorMessage(p);
      return (Abc_Ntk_t *)0x0;
    }
    pcVar12 = (char *)ppvVar23[1];
    pcVar24 = pcVar12;
    do {
      do {
        pcVar26 = pcVar12;
        pcVar12 = pcVar24 + 1;
        cVar1 = *pcVar24;
        pcVar24 = pcVar12;
      } while (cVar1 == '/');
    } while ((cVar1 == '\\') || (pcVar12 = pcVar26, cVar1 != '\0'));
    pcVar12 = Extra_UtilStrsav(pcVar26);
    pAVar11->pName = pcVar12;
  }
  else {
    iVar7 = strcmp(pcVar12,".exdc");
    if (iVar7 != 0) {
      pcVar12 = p->pFileName;
      uVar8 = Extra_FileReaderGetLineNumber(p->pReader,0);
      printf("%s: File parsing skipped after line %d (\"%s\").\n",pcVar12,(ulong)uVar8,
             *p->vTokens->pArray);
      Abc_NtkDelete(pAVar11);
      p->pNtkCur = (Abc_Ntk_t *)0x0;
      return (Abc_Ntk_t *)0x0;
    }
  }
  pFile = _stdout;
  local_40 = pAVar11;
  if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
    iVar7 = Extra_FileReaderGetFileSize(p->pReader);
    local_60 = Extra_ProgressBarStart(pFile,iVar7);
  }
  else {
    local_60 = (ProgressBar *)0x0;
  }
  pcVar12 = p->sError;
  local_44 = 0;
  bVar6 = false;
  iVar7 = 0;
  do {
    if (!bVar6) {
      pVVar13 = Io_ReadBlifGetTokens(p);
      p->vTokens = pVVar13;
      if (pVVar13 == (Vec_Ptr_t *)0x0) goto LAB_0032f309;
    }
    if (((p->pNtkMaster == (Abc_Ntk_t *)0x0) && (local_44 == (local_44 / 1000) * 1000)) &&
       ((iVar9 = Extra_FileReaderGetCurPosition(p->pReader), local_60 == (ProgressBar *)0x0 ||
        (local_60->nItemsNext <= iVar9)))) {
      Extra_ProgressBarUpdate_int(local_60,iVar9,(char *)0x0);
    }
    pVVar13 = p->vTokens;
    ppvVar23 = pVVar13->pArray;
    pcVar24 = (char *)*ppvVar23;
    iVar9 = strcmp(pcVar24,".names");
    if (iVar9 == 0) {
      if (pVVar13->nSize < 2) {
        iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
        p->LineCur = iVar7;
        builtin_strncpy(pcVar12,"The .names line has less than two tokens.",0x2a);
LAB_0032ef63:
        Io_ReadBlifPrintErrorMessage(p);
        bVar6 = true;
        goto LAB_0032ef71;
      }
      local_38 = p->pNtkCur;
      uVar8 = pVVar13->nSize - 2;
      pAVar18 = Io_ReadCreateNode(local_38,(char *)ppvVar23[(ulong)uVar8 + 1],
                                  (char **)(ppvVar23 + 1),uVar8);
      p->vCubes->nSize = 0;
      iVar7 = pVVar13->nSize;
      pVVar13 = Io_ReadBlifGetTokens(p);
      pAVar5 = pAVar18;
      if (iVar7 == 2) {
        if (pVVar13 != (Vec_Ptr_t *)0x0) {
LAB_0032e03a:
          cVar1 = **pVVar13->pArray;
          if (cVar1 != '.') {
            if (pVVar13->nSize == 1) break;
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar12,"The number of tokens in the cons",0x20);
LAB_0032e90b:
            builtin_strncpy(p->sError + 0x20,"tant cube is wrong.",0x14);
            goto LAB_0032ef63;
          }
          goto LAB_0032e4b8;
        }
      }
      else {
        while (local_68 = pAVar5, pVVar13 != (Vec_Ptr_t *)0x0) {
          ppvVar23 = pVVar13->pArray;
          pcVar24 = (char *)*ppvVar23;
          if (*pcVar24 == '.') goto LAB_0032e4b8;
          if (pVVar13->nSize != 2) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar12,"The number of tokens in the cube is wrong.",0x2b);
            goto LAB_0032ef63;
          }
          pVVar25 = p->vCubes;
          sVar16 = strlen(pcVar24);
          if (0 < (int)(uint)sVar16) {
            local_58._0_8_ = pVVar13;
            uVar17 = 0;
            do {
              cVar1 = pcVar24[uVar17];
              uVar8 = pVVar25->nSize;
              if (uVar8 == pVVar25->nCap) {
                if ((int)uVar8 < 0x10) {
                  if (pVVar25->pArray == (char *)0x0) {
                    pcVar26 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar26 = (char *)realloc(pVVar25->pArray,0x10);
                  }
                  pVVar25->pArray = pcVar26;
                  pVVar25->nCap = 0x10;
                }
                else {
                  __size = (ulong)uVar8 * 2;
                  if (pVVar25->pArray == (char *)0x0) {
                    pcVar26 = (char *)malloc(__size);
                  }
                  else {
                    pcVar26 = (char *)realloc(pVVar25->pArray,__size);
                  }
                  pVVar25->pArray = pcVar26;
                  pVVar25->nCap = (int)__size;
                }
              }
              else {
                pcVar26 = pVVar25->pArray;
              }
              iVar7 = pVVar25->nSize;
              pVVar25->nSize = iVar7 + 1;
              pcVar26[iVar7] = cVar1;
              uVar17 = uVar17 + 1;
            } while (((uint)sVar16 & 0x7fffffff) != uVar17);
            ppvVar23 = *(void ***)(local_58._0_8_ + 8);
          }
          pAVar18 = local_68;
          bVar2 = *ppvVar23[1];
          if (((1 < bVar2 - 0x30) && (bVar2 != 0x6e)) && (bVar2 != 0x78)) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar12,"The output character in the cons",0x20);
            goto LAB_0032e90b;
          }
          pVVar25 = p->vCubes;
          uVar8 = pVVar25->nSize;
          if (uVar8 == pVVar25->nCap) {
            if ((int)uVar8 < 0x10) {
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = 0x10;
            }
            else {
              sVar16 = (ulong)uVar8 * 2;
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar16);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = (int)sVar16;
            }
          }
          else {
            pcVar24 = pVVar25->pArray;
          }
          iVar7 = pVVar25->nSize;
          pVVar25->nSize = iVar7 + 1;
          pcVar24[iVar7] = ' ';
          pVVar25 = p->vCubes;
          uVar8 = pVVar25->nSize;
          if (uVar8 == pVVar25->nCap) {
            if ((int)uVar8 < 0x10) {
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = 0x10;
            }
            else {
              sVar16 = (ulong)uVar8 * 2;
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar16);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = (int)sVar16;
            }
          }
          else {
            pcVar24 = pVVar25->pArray;
          }
          iVar7 = pVVar25->nSize;
          pVVar25->nSize = iVar7 + 1;
          pcVar24[iVar7] = bVar2;
          pVVar25 = p->vCubes;
          uVar8 = pVVar25->nSize;
          if (uVar8 == pVVar25->nCap) {
            if ((int)uVar8 < 0x10) {
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(0x10);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = 0x10;
            }
            else {
              sVar16 = (ulong)uVar8 * 2;
              if (pVVar25->pArray == (char *)0x0) {
                pcVar24 = (char *)malloc(sVar16);
              }
              else {
                pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
              }
              pVVar25->pArray = pcVar24;
              pVVar25->nCap = (int)sVar16;
            }
          }
          else {
            pcVar24 = pVVar25->pArray;
          }
          iVar7 = pVVar25->nSize;
          pVVar25->nSize = iVar7 + 1;
          pcVar24[iVar7] = '\n';
          pVVar13 = Io_ReadBlifGetTokens(p);
          pAVar5 = local_68;
        }
      }
LAB_0032e4b5:
      pVVar13 = (Vec_Ptr_t *)0x0;
LAB_0032e4b8:
      pVVar25 = p->vCubes;
      iVar7 = pVVar25->nSize;
      if (iVar7 == 0) {
        iVar7 = 0;
        pcVar24 = pVVar25->pArray;
        if (pVVar25->nCap == 0) {
          if (pcVar24 == (char *)0x0) {
            pcVar24 = (char *)malloc(0x10);
            iVar7 = 0;
          }
          else {
            pcVar24 = (char *)realloc(pcVar24,0x10);
            iVar7 = pVVar25->nSize;
          }
          pVVar25->pArray = pcVar24;
          pVVar25->nCap = 0x10;
        }
        pVVar25->nSize = iVar7 + 1;
        pcVar24[iVar7] = ' ';
        pVVar25 = p->vCubes;
        uVar8 = pVVar25->nSize;
        if (uVar8 == pVVar25->nCap) {
          if ((int)uVar8 < 0x10) {
            if (pVVar25->pArray == (char *)0x0) {
              pcVar24 = (char *)malloc(0x10);
            }
            else {
              pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
            }
            pVVar25->pArray = pcVar24;
            pVVar25->nCap = 0x10;
          }
          else {
            sVar16 = (ulong)uVar8 * 2;
            if (pVVar25->pArray == (char *)0x0) {
              pcVar24 = (char *)malloc(sVar16);
            }
            else {
              pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
            }
            pVVar25->pArray = pcVar24;
            pVVar25->nCap = (int)sVar16;
          }
        }
        else {
          pcVar24 = pVVar25->pArray;
        }
        iVar7 = pVVar25->nSize;
        pVVar25->nSize = iVar7 + 1;
        pcVar24[iVar7] = '0';
        pVVar25 = p->vCubes;
        uVar8 = pVVar25->nSize;
        if (uVar8 == pVVar25->nCap) {
          if ((int)uVar8 < 0x10) {
            if (pVVar25->pArray == (char *)0x0) {
              pcVar24 = (char *)malloc(0x10);
            }
            else {
              pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
            }
            pVVar25->pArray = pcVar24;
            pVVar25->nCap = 0x10;
          }
          else {
            sVar16 = (ulong)uVar8 * 2;
            if (pVVar25->pArray == (char *)0x0) {
              pcVar24 = (char *)malloc(sVar16);
            }
            else {
              pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
            }
            pVVar25->pArray = pcVar24;
            pVVar25->nCap = (int)sVar16;
          }
        }
        else {
          pcVar24 = pVVar25->pArray;
        }
        iVar7 = pVVar25->nSize;
        pVVar25->nSize = iVar7 + 1;
        pcVar24[iVar7] = '\n';
        pVVar25 = p->vCubes;
        iVar7 = pVVar25->nSize;
      }
      if (iVar7 == pVVar25->nCap) {
        if (iVar7 < 0x10) {
          if (pVVar25->pArray == (char *)0x0) {
            pcVar24 = (char *)malloc(0x10);
          }
          else {
            pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
          }
          pVVar25->pArray = pcVar24;
          pVVar25->nCap = 0x10;
        }
        else {
          uVar8 = iVar7 * 2;
          if (pVVar25->pArray == (char *)0x0) {
            pcVar24 = (char *)malloc((ulong)uVar8);
          }
          else {
            pcVar24 = (char *)realloc(pVVar25->pArray,(ulong)uVar8);
          }
          pVVar25->pArray = pcVar24;
          pVVar25->nCap = uVar8;
        }
      }
      else {
        pcVar24 = pVVar25->pArray;
      }
      iVar7 = pVVar25->nSize;
      pVVar25->nSize = iVar7 + 1;
      pcVar24[iVar7] = '\0';
      pcVar24 = Abc_SopRegister((Mem_Flex_t *)local_38->pManFunc,p->vCubes->pArray);
      (pAVar18->field_5).pData = pcVar24;
      iVar7 = (pAVar18->vFanins).nSize;
      iVar9 = Abc_SopGetVarNum(pcVar24);
      if (iVar7 != iVar9) {
        iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
        p->LineCur = iVar7;
        uVar8 = (pAVar18->vFanins).nSize;
        pcVar24 = Abc_ObjName((Abc_Obj_t *)pAVar18->pNtk->vObjs->pArray[*(pAVar18->vFanouts).pArray]
                             );
        uVar10 = Abc_SopGetVarNum((char *)(pAVar18->field_5).pData);
        sprintf(pcVar12,"The number of fanins (%d) of node %s is different from SOP size (%d).",
                (ulong)uVar8,pcVar24,(ulong)uVar10);
        goto LAB_0032ef63;
      }
      p->vTokens = pVVar13;
      if (pVVar13 == (Vec_Ptr_t *)0x0) goto LAB_0032f309;
      iVar7 = 0;
      bVar6 = true;
    }
    else {
      iVar9 = strcmp(pcVar24,".gate");
      if (iVar9 == 0) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        if (pLib == (Mio_Library_t *)0x0) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar12,"The current library is not available.",0x26);
        }
        else if (pVVar13->nSize < 2) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar12,"The .gate line has less than two tokens.",0x29);
        }
        else {
          pMVar14 = Mio_LibraryReadGateByName(pLib,(char *)pVVar13->pArray[1],(char *)0x0);
          if (pMVar14 == (Mio_Gate_t *)0x0) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            pvVar21 = pVVar13->pArray[1];
            pcVar24 = "Cannot find gate \"%s\" in the library.";
          }
          else {
            pAVar11 = p->pNtkCur;
            if (pAVar11->nObjCounts[7] == 0) {
              if (pAVar11->ntkFunc != ABC_FUNC_SOP) {
                __assert_fail("p->pNtkCur->ntkFunc == ABC_FUNC_SOP",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x2cd,"int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              pAVar11->ntkFunc = ABC_FUNC_MAP;
              Mem_FlexStop((Mem_Flex_t *)pAVar11->pManFunc,0);
              p->pNtkCur->pManFunc = pLib;
            }
            pMVar15 = Mio_GateReadTwin(pMVar14);
            iVar7 = Io_ReadBlifReorderFormalNames(pVVar13,pMVar14,pMVar15);
            if (iVar7 != 0) {
              iVar7 = pVVar13->nSize;
              if (2 < (long)iVar7) {
                ppvVar23 = pVVar13->pArray;
                lVar19 = 2;
                do {
                  pcVar24 = (char *)ppvVar23[lVar19];
                  sVar16 = strlen(pcVar24);
                  if (0 < (int)(uint)sVar16) {
                    uVar17 = (ulong)((uint)sVar16 & 0x7fffffff);
                    do {
                      pcVar26 = pcVar24 + 1;
                      if (*pcVar24 == '=') goto LAB_0032e60f;
                      uVar17 = uVar17 - 1;
                      pcVar24 = pcVar26;
                    } while (uVar17 != 0);
                  }
                  pcVar26 = (char *)0x0;
LAB_0032e60f:
                  ppvVar23[lVar19] = pcVar26;
                  ppvVar23 = pVVar13->pArray;
                  if (ppvVar23[lVar19] == (void *)0x0) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar12,"Invalid gate input assignment.",0x1f);
                    goto LAB_0032e9f7;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != iVar7);
              }
              pMVar15 = Mio_GateReadTwin(pMVar14);
              ppvVar23 = pVVar13->pArray;
              pNamesIn = (char **)(ppvVar23 + 2);
              iVar7 = pVVar13->nSize;
              if (pMVar15 == (Mio_Gate_t *)0x0) {
                pAVar18 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar23[(long)iVar7 + -1],pNamesIn,
                                            iVar7 + -3);
                (pAVar18->field_5).pData = pMVar14;
                goto LAB_0032e6ed;
              }
              if ((char *)ppvVar23[(long)iVar7 + -2] == (char *)0x0) {
                pcVar24 = (char *)ppvVar23[(long)iVar7 + -1];
                if (pcVar24 == (char *)0x0) {
                  __assert_fail("ppNames[nNames] != NULL || ppNames[nNames+1] != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                ,0x2f6,"int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)");
                }
LAB_0032efa7:
                pAVar18 = Io_ReadCreateNode(p->pNtkCur,pcVar24,pNamesIn,iVar7 + -4);
                pMVar14 = Mio_GateReadTwin(pMVar14);
                (pAVar18->field_5).pData = pMVar14;
              }
              else {
                pAVar18 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar23[(long)iVar7 + -2],pNamesIn,
                                            iVar7 + -4);
                (pAVar18->field_5).pData = pMVar14;
                pcVar24 = (char *)ppvVar23[(long)iVar7 + -1];
                if (pcVar24 != (char *)0x0) goto LAB_0032efa7;
              }
              bVar6 = false;
              iVar7 = 0;
              goto LAB_0032ef76;
            }
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            pvVar21 = pVVar13->pArray[1];
            pcVar24 = "Mismatch in the fanins of gate \"%s\".";
          }
LAB_0032e9f0:
          sprintf(pcVar12,pcVar24,pvVar21);
        }
LAB_0032e9f7:
        bVar6 = false;
        Io_ReadBlifPrintErrorMessage(p);
LAB_0032ef71:
        iVar7 = 1;
      }
      else {
        iVar9 = strcmp(pcVar24,".latch");
        if (iVar9 == 0) {
          if (pVVar13->nSize < 3) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar12,"The .latch line does not have enough tokens.",0x2d);
            goto LAB_0032e9f7;
          }
          pAVar18 = Io_ReadCreateLatch(p->pNtkCur,(char *)ppvVar23[1],(char *)ppvVar23[2]);
          if ((long)pVVar13->nSize == 3) {
            uVar10 = *(uint *)&pAVar18->field_0x14 & 0xf;
          }
          else {
            uVar8 = atoi((char *)pVVar13->pArray[(long)pVVar13->nSize + -1]);
            if (2 < uVar8) {
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              pvVar21 = pVVar13->pArray[3];
              pcVar24 = "The .latch line has an unknown reset value (%s).";
              goto LAB_0032e9f0;
            }
            uVar10 = *(uint *)&pAVar18->field_0x14 & 0xf;
            if (uVar8 != 2) {
              if (uVar8 == 1) {
                if (uVar10 != 8) {
                  __assert_fail("Abc_ObjIsLatch(pLatch)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
                }
                pAVar18->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
              }
              else {
                if (uVar10 != 8) {
                  __assert_fail("Abc_ObjIsLatch(pLatch)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
                }
                pAVar18->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              }
              goto LAB_0032e6ed;
            }
          }
          if (uVar10 != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
          }
          pAVar18->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
LAB_0032e6ed:
          bVar6 = false;
          iVar7 = 0;
        }
        else {
          iVar9 = strcmp(pcVar24,".inputs");
          if (iVar9 == 0) {
            if (1 < pVVar13->nSize) {
              lVar19 = 1;
              do {
                Io_ReadCreatePi(p->pNtkCur,(char *)pVVar13->pArray[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 < pVVar13->nSize);
            }
            goto LAB_0032e6ed;
          }
          iVar9 = strcmp(pcVar24,".outputs");
          if (iVar9 == 0) {
            if (1 < pVVar13->nSize) {
              lVar19 = 1;
              do {
                Io_ReadCreatePo(p->pNtkCur,(char *)pVVar13->pArray[lVar19]);
                lVar19 = lVar19 + 1;
              } while (lVar19 < pVVar13->nSize);
            }
            goto LAB_0032e6ed;
          }
          iVar9 = strcmp(pcVar24,".input_arrival");
          if (iVar9 == 0) {
            iVar7 = strncmp(pcVar24,".input_arrival",0xe);
            if (iVar7 != 0) {
              __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_arrival\", 14 ) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                            ,0x356,
                            "int Io_ReadBlifNetworkInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)");
            }
            if (pVVar13->nSize == 4) {
              pAVar18 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar23[1]);
              if (pAVar18 != (Abc_Obj_t *)0x0) {
                dVar4 = strtod((char *)pVVar13->pArray[2],&local_70);
                local_58._0_8_ = dVar4;
                pAVar5 = (Abc_Obj_t *)strtod((char *)pVVar13->pArray[3],&local_78);
                if ((*local_70 == '\0') && (*local_78 == '\0')) {
                  local_68 = pAVar5;
                  Vec_IntPush(p->vInArrs,
                              *(int *)((long)pAVar18->pNtk->vObjs->pArray
                                             [*(pAVar18->vFanins).pArray] + 0x10));
                  Vec_IntPush(p->vInArrs,(int)(float)(double)local_58._0_8_);
                  p_00 = p->vInArrs;
LAB_0032f1a8:
                  Vec_IntPush(p_00,(int)(float)(double)local_68);
                  goto LAB_0032f212;
                }
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                pvVar21 = pVVar13->pArray[2];
                pvVar20 = pVVar13->pArray[3];
                pcVar24 = "Bad value (%s %s) for rise or fall time on .input_arrival line.";
                goto LAB_0032ed7f;
              }
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              pvVar21 = pVVar13->pArray[1];
              pcVar24 = "Cannot find object corresponding to %s on .input_arrival line.";
LAB_0032f06e:
              sprintf(pcVar12,pcVar24,pvVar21);
            }
            else {
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              builtin_strncpy(pcVar12,"Wrong number of arguments on .input_arrival line.",0x32);
            }
LAB_0032f075:
            Io_ReadBlifPrintErrorMessage(p);
            iVar7 = 1;
          }
          else {
            iVar9 = strcmp(pcVar24,".output_required");
            if (iVar9 == 0) {
              iVar7 = strncmp(pcVar24,".output_required",0x10);
              if (iVar7 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_required\", 16 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x389,
                              "int Io_ReadBlifNetworkOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              if (pVVar13->nSize == 4) {
                pAVar18 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar23[1]);
                if (pAVar18 == (Abc_Obj_t *)0x0) {
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar21 = pVVar13->pArray[1];
                  pcVar24 = "Cannot find object corresponding to %s on .output_required line.";
                  goto LAB_0032f06e;
                }
                dVar4 = strtod((char *)pVVar13->pArray[2],&local_70);
                local_58._0_8_ = dVar4;
                pAVar5 = (Abc_Obj_t *)strtod((char *)pVVar13->pArray[3],&local_78);
                if ((*local_70 == '\0') && (*local_78 == '\0')) {
                  local_68 = pAVar5;
                  Vec_IntPush(p->vOutReqs,
                              *(int *)((long)pAVar18->pNtk->vObjs->pArray
                                             [*(pAVar18->vFanouts).pArray] + 0x10));
                  Vec_IntPush(p->vOutReqs,(int)(float)(double)local_58._0_8_);
                  p_00 = p->vOutReqs;
                  goto LAB_0032f1a8;
                }
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                pvVar21 = pVVar13->pArray[2];
                pvVar20 = pVVar13->pArray[3];
                pcVar24 = "Bad value (%s %s) for rise or fall time on .output_required line.";
LAB_0032ed7f:
                sprintf(pcVar12,pcVar24,pvVar21,pvVar20);
              }
              else {
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                builtin_strncpy(pcVar12,"Wrong number of arguments on .output_required line.",0x34);
              }
              goto LAB_0032f075;
            }
            iVar9 = strcmp(pcVar24,".default_input_arrival");
            if (iVar9 == 0) {
              iVar7 = strncmp(pcVar24,".default_input_arrival",0x17);
              if (iVar7 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_arrival\", 23 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x3bb,
                              "int Io_ReadBlifNetworkDefaultInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)"
                             );
              }
              if (pVVar13->nSize == 3) {
                dVar4 = strtod((char *)ppvVar23[1],&local_70);
                local_58._8_4_ = extraout_XMM0_Dc;
                local_58._0_8_ = dVar4;
                local_58._12_4_ = extraout_XMM0_Dd;
                dVar4 = strtod((char *)pVVar13->pArray[2],&local_78);
                if ((*local_70 == '\0') && (*local_78 == '\0')) {
                  p->DefInArrRise = (float)(double)local_58._0_8_;
                  p->DefInArrFall = (float)dVar4;
                  p->fHaveDefInArr = 1;
LAB_0032f212:
                  iVar7 = 0;
                  goto LAB_0032f082;
                }
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                pvVar21 = pVVar13->pArray[1];
                pvVar20 = pVVar13->pArray[2];
                pcVar24 = "Bad value (%s %s) for rise or fall time on .default_input_arrival line.";
                goto LAB_0032ed7f;
              }
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              builtin_strncpy(pcVar12,"Wrong number of arguments on .default_input_arrival line.",
                              0x3a);
              goto LAB_0032f075;
            }
            iVar9 = strcmp(pcVar24,".default_output_required");
            if (iVar9 == 0) {
              iVar7 = strncmp(pcVar24,".default_output_required",0x19);
              if (iVar7 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_output_required\", 25 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x3e5,
                              "int Io_ReadBlifNetworkDefaultOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)"
                             );
              }
              if (pVVar13->nSize == 3) {
                dVar4 = strtod((char *)ppvVar23[1],&local_70);
                local_58._8_4_ = extraout_XMM0_Dc_00;
                local_58._0_8_ = dVar4;
                local_58._12_4_ = extraout_XMM0_Dd_00;
                dVar4 = strtod((char *)pVVar13->pArray[2],&local_78);
                if ((*local_70 == '\0') && (*local_78 == '\0')) {
                  p->DefOutReqRise = (float)(double)local_58._0_8_;
                  p->DefOutReqFall = (float)dVar4;
                  p->fHaveDefOutReq = 1;
                  goto LAB_0032f212;
                }
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                pvVar21 = pVVar13->pArray[1];
                pvVar20 = pVVar13->pArray[2];
                pcVar24 = 
                "Bad value (%s %s) for rise or fall time on .default_output_required line.";
                goto LAB_0032ed7f;
              }
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              builtin_strncpy(pcVar12,"Wrong number of arguments on .default_output_required line.",
                              0x3c);
              goto LAB_0032f075;
            }
            iVar9 = strcmp(pcVar24,".input_drive");
            if (iVar9 == 0) {
              iVar7 = strncmp(pcVar24,".input_drive",0xc);
              if (iVar7 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_drive\", 12 ) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x41a,
                              "int Io_ReadBlifNetworkInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              if (pVVar13->nSize == 4) {
                pAVar18 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar23[1]);
                if (pAVar18 == (Abc_Obj_t *)0x0) {
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar21 = pVVar13->pArray[1];
                  pcVar24 = "Cannot find object corresponding to %s on .input_drive line.";
                  goto LAB_0032f06e;
                }
                dVar4 = strtod((char *)pVVar13->pArray[2],&local_70);
                local_58._0_8_ = dVar4;
                pAVar5 = (Abc_Obj_t *)strtod((char *)pVVar13->pArray[3],&local_78);
                if ((*local_70 == '\0') && (*local_78 == '\0')) {
                  iVar7 = *(int *)((long)pAVar18->pNtk->vObjs->pArray[*(pAVar18->vFanins).pArray] +
                                  0x10);
                  if ((long)iVar7 < 0) {
LAB_0032f487:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  pVVar13 = p->pNtkCur->vObjs;
                  if (pVVar13->nSize <= iVar7) goto LAB_0032f487;
                  pVVar3 = p->pNtkCur->vCis;
                  lVar19 = (long)pVVar3->nSize;
                  iVar9 = -1;
                  if (0 < lVar19) {
                    lVar22 = 0;
                    do {
                      if (pVVar3->pArray[lVar22] == pVVar13->pArray[iVar7]) {
                        iVar9 = (int)lVar22;
                        break;
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar19 != lVar22);
                  }
                  local_68 = pAVar5;
                  Vec_IntPush(p->vInDrives,iVar9);
                  Vec_IntPush(p->vInDrives,(int)(float)(double)local_58._0_8_);
                  p_00 = p->vInDrives;
                  goto LAB_0032f1a8;
                }
                iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar7;
                pvVar21 = pVVar13->pArray[2];
                pvVar20 = pVVar13->pArray[3];
                pcVar24 = "Bad value (%s %s) for rise or fall time on .input_drive line.";
                goto LAB_0032ed7f;
              }
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              builtin_strncpy(pcVar12,"Wrong number of arguments on .input_drive line.",0x30);
              goto LAB_0032f075;
            }
            iVar9 = strcmp(pcVar24,".output_load");
            if (iVar9 != 0) {
              iVar9 = strcmp(pcVar24,".default_input_drive");
              if (iVar9 == 0) {
                iVar7 = Io_ReadBlifNetworkDefaultInputDrive(p,pVVar13);
                goto LAB_0032f082;
              }
              iVar9 = strcmp(pcVar24,".default_output_load");
              if (iVar9 == 0) {
                iVar7 = Io_ReadBlifNetworkDefaultOutputLoad(p,pVVar13);
                goto LAB_0032f082;
              }
              iVar9 = strcmp(pcVar24,".and_gate_delay");
              if (iVar9 == 0) {
                iVar7 = Io_ReadBlifNetworkAndGateDelay(p,pVVar13);
                goto LAB_0032f082;
              }
              iVar9 = strcmp(pcVar24,".exdc");
              if (iVar9 == 0) goto LAB_0032f309;
              iVar9 = strcmp(pcVar24,".end");
              if (iVar9 == 0) {
                pVVar13 = Io_ReadBlifGetTokens(p);
                p->vTokens = pVVar13;
                goto LAB_0032f309;
              }
              iVar9 = strcmp(pcVar24,".blackbox");
              pAVar11 = local_40;
              if (iVar9 == 0) {
                local_40->ntkType = ABC_NTK_NETLIST;
                local_40->ntkFunc = ABC_FUNC_BLACKBOX;
                bVar6 = false;
                Mem_FlexStop((Mem_Flex_t *)local_40->pManFunc,0);
                pAVar11->pManFunc = (void *)0x0;
              }
              else {
                pcVar26 = p->pFileName;
                bVar6 = false;
                uVar8 = Extra_FileReaderGetLineNumber(p->pReader,0);
                printf("%s (line %d): Skipping directive \"%s\".\n",pcVar26,(ulong)uVar8,pcVar24);
              }
              goto LAB_0032ef76;
            }
            iVar7 = Io_ReadBlifNetworkOutputLoad(p,pVVar13);
          }
LAB_0032f082:
          bVar6 = false;
        }
      }
LAB_0032ef76:
      if (p->vTokens == (Vec_Ptr_t *)0x0) {
LAB_0032f309:
        if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
          Extra_ProgressBarStop(local_60);
          return local_40;
        }
        return local_40;
      }
      if (iVar7 == 1) {
        Extra_ProgressBarStop(local_60);
        Abc_NtkDelete(local_40);
        return (Abc_Ntk_t *)0x0;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
  pVVar25 = p->vCubes;
  uVar8 = pVVar25->nSize;
  if (uVar8 == pVVar25->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(0x10);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = 0x10;
    }
    else {
      sVar16 = (ulong)uVar8 * 2;
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(sVar16);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = (int)sVar16;
    }
  }
  else {
    pcVar24 = pVVar25->pArray;
  }
  iVar7 = pVVar25->nSize;
  pVVar25->nSize = iVar7 + 1;
  pcVar24[iVar7] = ' ';
  pVVar25 = p->vCubes;
  uVar8 = pVVar25->nSize;
  if (uVar8 == pVVar25->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(0x10);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = 0x10;
    }
    else {
      sVar16 = (ulong)uVar8 * 2;
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(sVar16);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = (int)sVar16;
    }
  }
  else {
    pcVar24 = pVVar25->pArray;
  }
  iVar7 = pVVar25->nSize;
  pVVar25->nSize = iVar7 + 1;
  pcVar24[iVar7] = cVar1;
  pVVar25 = p->vCubes;
  uVar8 = pVVar25->nSize;
  if (uVar8 == pVVar25->nCap) {
    if ((int)uVar8 < 0x10) {
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(0x10);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,0x10);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = 0x10;
    }
    else {
      sVar16 = (ulong)uVar8 * 2;
      if (pVVar25->pArray == (char *)0x0) {
        pcVar24 = (char *)malloc(sVar16);
      }
      else {
        pcVar24 = (char *)realloc(pVVar25->pArray,sVar16);
      }
      pVVar25->pArray = pcVar24;
      pVVar25->nCap = (int)sVar16;
    }
  }
  else {
    pcVar24 = pVVar25->pArray;
  }
  iVar7 = pVVar25->nSize;
  pVVar25->nSize = iVar7 + 1;
  pcVar24[iVar7] = '\n';
  pVVar13 = Io_ReadBlifGetTokens(p);
  if (pVVar13 == (Vec_Ptr_t *)0x0) goto LAB_0032e4b5;
  goto LAB_0032e03a;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifNetworkOne( Io_ReadBlif_t * p )
{
    ProgressBar * pProgress = NULL;
    Abc_Ntk_t * pNtk;
    char * pDirective;
    int iLine, fTokensReady, fStatus;

    // make sure the tokens are present
    assert( p->vTokens != NULL );

    // create the new network
    p->pNtkCur = pNtk = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_SOP, 1 );
    // read the model name
    if ( strcmp( (char *)p->vTokens->pArray[0], ".model" ) == 0 )
    {
        char * pToken, * pPivot;
        if ( Vec_PtrSize(p->vTokens) != 2 )
        {
            p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
            sprintf( p->sError, "The .model line does not have exactly two entries." );
            Io_ReadBlifPrintErrorMessage( p );
            return NULL;
        }
        for ( pPivot = pToken = (char *)Vec_PtrEntry(p->vTokens, 1); *pToken; pToken++ )
            if ( *pToken == '/' || *pToken == '\\' )
                pPivot = pToken+1;
        pNtk->pName = Extra_UtilStrsav( pPivot );
    }
    else if ( strcmp( (char *)p->vTokens->pArray[0], ".exdc" ) != 0 ) 
    {
        printf( "%s: File parsing skipped after line %d (\"%s\").\n", p->pFileName, 
            Extra_FileReaderGetLineNumber(p->pReader, 0), (char*)p->vTokens->pArray[0] );
        Abc_NtkDelete(pNtk);
        p->pNtkCur = NULL;
        return NULL;
    }

    // read the inputs/outputs
    if ( p->pNtkMaster == NULL )
        pProgress = Extra_ProgressBarStart( stdout, Extra_FileReaderGetFileSize(p->pReader) );
    fTokensReady = fStatus = 0;
    for ( iLine = 0; fTokensReady || (p->vTokens = Io_ReadBlifGetTokens(p)); iLine++ )
    {
        if ( p->pNtkMaster == NULL && iLine % 1000 == 0 )
            Extra_ProgressBarUpdate( pProgress, Extra_FileReaderGetCurPosition(p->pReader), NULL );

        // consider different line types
        fTokensReady = 0;
        pDirective = (char *)p->vTokens->pArray[0];
        if ( !strcmp( pDirective, ".names" ) )
            { fStatus = Io_ReadBlifNetworkNames( p, &p->vTokens ); fTokensReady = 1; }
        else if ( !strcmp( pDirective, ".gate" ) )
            fStatus = Io_ReadBlifNetworkGate( p, p->vTokens );
        else if ( !strcmp( pDirective, ".latch" ) )
            fStatus = Io_ReadBlifNetworkLatch( p, p->vTokens );
        else if ( !strcmp( pDirective, ".inputs" ) )
            fStatus = Io_ReadBlifNetworkInputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".outputs" ) )
            fStatus = Io_ReadBlifNetworkOutputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_arrival" ) )
            fStatus = Io_ReadBlifNetworkInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_required" ) )
            fStatus = Io_ReadBlifNetworkOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_arrival" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_required" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_drive" ) )
            fStatus = Io_ReadBlifNetworkInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_load" ) )
            fStatus = Io_ReadBlifNetworkOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_drive" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_load" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".and_gate_delay" ) )
            fStatus = Io_ReadBlifNetworkAndGateDelay( p, p->vTokens );
//        else if ( !strcmp( pDirective, ".subckt" ) )
//            fStatus = Io_ReadBlifNetworkSubcircuit( p, p->vTokens );
        else if ( !strcmp( pDirective, ".exdc" ) )
            break;
        else if ( !strcmp( pDirective, ".end" ) )
        {
            p->vTokens = Io_ReadBlifGetTokens(p);
            break;
        }
        else if ( !strcmp( pDirective, ".blackbox" ) )
        {
            pNtk->ntkType = ABC_NTK_NETLIST;
            pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
            pNtk->pManFunc = NULL;
        }
        else
            printf( "%s (line %d): Skipping directive \"%s\".\n", p->pFileName, 
                Extra_FileReaderGetLineNumber(p->pReader, 0), pDirective );
        if ( p->vTokens == NULL ) // some files do not have ".end" in the end
            break;
        if ( fStatus == 1 )
        {
            Extra_ProgressBarStop( pProgress );
            Abc_NtkDelete( pNtk );
            return NULL;
        }
    }
    if ( p->pNtkMaster == NULL )
        Extra_ProgressBarStop( pProgress );
    return pNtk;
}